

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arguments.c
# Opt level: O2

void print_usage(void)

{
  puts("Usage: fifos -s/--size <bytes> -c/--count <number>");
  exit(1);
}

Assistant:

void print_usage() {
	printf(
			"Usage: fifos "
			"-s/--size <bytes> "
			"-c/--count <number>"
			"\n");
	exit(EXIT_FAILURE);
}